

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

void __thiscall QDirPrivate::initFileLists(QDirPrivate *this,QDir *dir)

{
  long lVar1;
  bool bVar2;
  QFlagsStorage<QDir::Filter> QVar3;
  const_iterator this_00;
  QString *in_RSI;
  QDirListing *in_RDI;
  long in_FS_OFFSET;
  value_type *dirEntry;
  QDirListing *__range2;
  SortFlags in_stack_00000064;
  sentinel __end2;
  const_iterator __begin2;
  QFileInfoList l;
  QMutexLocker<QMutex> locker;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  QMutexLocker<QMutex> *in_stack_ffffffffffffff10;
  QDir *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  QStringList *nameFilters;
  QDirListing *this_01;
  const_iterator local_80;
  QFlagsStorage<QDir::Filter> local_74 [13];
  QDirListing local_40;
  QFileInfoList *infos;
  QStringList *names;
  QFileInfoList *l_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            (in_stack_ffffffffffffff10,
             (QMutex *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff18);
  if (!bVar2) {
    infos = (QFileInfoList *)&DAT_aaaaaaaaaaaaaaaa;
    names = (QStringList *)&DAT_aaaaaaaaaaaaaaaa;
    l_00 = (QFileInfoList *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QFileInfo>::QList((QList<QFileInfo> *)0x28717c);
    nameFilters = (QStringList *)&DAT_aaaaaaaaaaaaaaaa;
    QDir::path(in_stack_ffffffffffffff18);
    QDir::nameFilters(in_stack_ffffffffffffff18);
    QVar3.i = (Int)QDir::filter((QDir *)in_stack_ffffffffffffff10);
    local_74[0].i = QVar3.i;
    QFlags<QDir::Filter>::toInt((QFlags<QDir::Filter> *)local_74);
    QDirListing::QDirListing
              (in_RDI,in_RSI,nameFilters,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    QList<QString>::~QList((QList<QString> *)0x287207);
    QString::~QString((QString *)0x287214);
    this_01 = &local_40;
    local_80.dirEntry.dirListPtr = (DirEntry)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = QDirListing::begin((QDirListing *)CONCAT44(QVar3.i,in_stack_ffffffffffffff20));
    local_80 = this_00;
    QDirListing::end(this_01);
    while( true ) {
      bVar2 = ::operator!=(&local_80);
      if (!bVar2) break;
      in_stack_ffffffffffffff10 =
           (QMutexLocker<QMutex> *)QDirListing::const_iterator::operator*(&local_80);
      QDirListing::DirEntry::fileInfo((DirEntry *)this_00.dirEntry.dirListPtr);
      QList<QFileInfo>::emplace_back<QFileInfo>
                ((QList<QFileInfo> *)in_stack_ffffffffffffff10,
                 (QFileInfo *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      QFileInfo::~QFileInfo((QFileInfo *)0x28734e);
      QDirListing::const_iterator::operator++
                ((const_iterator *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    }
    QDirListing::~QDirListing((QDirListing *)in_stack_ffffffffffffff10);
    sortFileList(in_stack_00000064,l_00,names,infos);
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
    QList<QFileInfo>::~QList((QList<QFileInfo> *)0x2873db);
  }
  QMutexLocker<QMutex>::~QMutexLocker(in_stack_ffffffffffffff10);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QDirPrivate::initFileLists(const QDir &dir) const
{
    QMutexLocker locker(&fileCache.mutex);
    if (!fileCache.fileListsInitialized) {
        QFileInfoList l;
        for (const auto &dirEntry : QDirListing(dir.path(), dir.nameFilters(),
                                                dir.filter().toInt())) {
            l.emplace_back(dirEntry.fileInfo());
        }

        sortFileList(sort, l, &fileCache.files, &fileCache.fileInfos);
        fileCache.fileListsInitialized = true;
    }
}